

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ColColDAGNode::assignPrimitive_(ColColDAGNode *this)

{
  int iVar1;
  invalid_argument *this_00;
  ColColDAGNode *this_local;
  
  iVar1 = this->op_;
  if (iVar1 == 1) {
    this->primitive = map_add_int32_col_int32_col;
  }
  else if (iVar1 == 2) {
    this->primitive = map_sub_int32_col_int32_col;
  }
  else {
    if (iVar1 != 3) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Unkonwn op");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this->primitive = map_mul_int32_col_int32_col;
  }
  return;
}

Assistant:

void assignPrimitive_() {
        switch (op_)
        {
            case OP_ADD:
                primitive = map_add_int32_col_int32_col;
                break;

            case OP_MUL:
                primitive = map_mul_int32_col_int32_col;
                break;

            case OP_SUB:
                primitive = map_sub_int32_col_int32_col;
                break;

            default:
                throw std::invalid_argument("Unkonwn op");
        }
    }